

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int local_40;
  int local_3c;
  int iFirst;
  int rc;
  char *pCsr;
  SnippetPhrase *pPhrase;
  SnippetIter *p;
  void *ctx_local;
  Fts3Expr *pFStack_10;
  int iPhrase_local;
  Fts3Expr *pExpr_local;
  
  pCsr = (char *)(*(long *)((long)ctx + 0x18) + (long)iPhrase * 0x30);
  *(int *)pCsr = pExpr->pPhrase->nToken;
  pPhrase = (SnippetPhrase *)ctx;
  p = (SnippetIter *)ctx;
  ctx_local._4_4_ = iPhrase;
  pFStack_10 = pExpr;
  local_3c = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),(char **)&iFirst);
  if (_iFirst != (char *)0x0) {
    local_40 = 0;
    *(char **)(pCsr + 8) = _iFirst;
    fts3GetDeltaPosition((char **)&iFirst,&local_40);
    if (local_40 < 0) {
      local_3c = 0x10b;
    }
    else {
      *(char **)(pCsr + 0x18) = _iFirst;
      *(char **)(pCsr + 0x28) = _iFirst;
      *(int *)(pCsr + 0x10) = local_40;
      *(int *)(pCsr + 0x20) = local_40;
    }
  }
  return local_3c;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    int iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    if( iFirst<0 ){
      rc = FTS_CORRUPT_VTAB;
    }else{
      pPhrase->pHead = pCsr;
      pPhrase->pTail = pCsr;
      pPhrase->iHead = iFirst;
      pPhrase->iTail = iFirst;
    }
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0 
    ));
  }

  return rc;
}